

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VoxWriter.cpp
# Opt level: O0

void __thiscall
vox::VoxWriter::AddColor(VoxWriter *this,uint8_t *r,uint8_t *g,uint8_t *b,uint8_t *a,uint8_t *index)

{
  uint32_t uVar1;
  size_type sVar2;
  uint32_t *puVar3;
  value_type_conflict1 local_3c;
  byte *local_38;
  uint8_t *index_local;
  uint8_t *a_local;
  uint8_t *b_local;
  uint8_t *g_local;
  uint8_t *r_local;
  VoxWriter *this_local;
  
  local_38 = index;
  index_local = a;
  a_local = b;
  b_local = g;
  g_local = r;
  r_local = (uint8_t *)this;
  while( true ) {
    sVar2 = std::vector<int,_std::allocator<int>_>::size(&this->colors);
    if (*local_38 < sVar2) break;
    local_3c = 0;
    std::vector<int,_std::allocator<int>_>::push_back(&this->colors,&local_3c);
  }
  uVar1 = GetID(g_local,b_local,a_local,index_local);
  puVar3 = (uint32_t *)
           std::vector<int,_std::allocator<int>_>::operator[](&this->colors,(ulong)*local_38);
  *puVar3 = uVar1;
  return;
}

Assistant:

void VoxWriter::AddColor(const uint8_t& r, const uint8_t& g, const uint8_t& b, const uint8_t& a, const uint8_t& index) {
    while (colors.size() <= index)
        colors.push_back(0);
    colors[index] = GetID(r, g, b, a);
}